

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_gprim_predefined<tinyusdz::GPrim>
                   (string *__return_storage_ptr__,GPrim *gprim,uint32_t indent)

{
  bool bVar1;
  TypedAttributeWithFallback<bool> *attr;
  TypedAttributeWithFallback<tinyusdz::Orientation> *attr_00;
  TypedAttributeWithFallback<tinyusdz::Purpose> *attr_01;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr_02;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *attr_03;
  Relationship *this;
  uint32_t indent_00;
  GPrim *pGVar2;
  tinyusdz *local_448;
  tinyusdz *local_3d0;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  ListEditQual local_37c;
  string local_378;
  Relationship *local_358;
  Relationship *rel;
  string local_330;
  allocator local_309;
  string local_308;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  GPrim *pGStack_18;
  uint32_t indent_local;
  GPrim *gprim_local;
  
  local_1c = indent;
  pGStack_18 = gprim;
  gprim_local = (GPrim *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  attr = &pGStack_18->doubleSided;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"doubleSided",&local_1e9);
  print_typed_attr<bool>(&local_1c8,attr,&local_1e8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  attr_00 = &pGStack_18->orientation;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_230,"orientation",&local_231);
  print_typed_token_attr<tinyusdz::Orientation>(&local_210,attr_00,&local_230,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  attr_01 = &pGStack_18->purpose;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_278,"purpose",&local_279);
  print_typed_token_attr<tinyusdz::Purpose>(&local_258,attr_01,&local_278,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  attr_02 = &pGStack_18->extent;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c0,"extent",&local_2c1);
  print_typed_attr<tinyusdz::Extent>(&local_2a0,attr_02,&local_2c0,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  attr_03 = &pGStack_18->visibility;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_308,"visibility",&local_309);
  print_typed_token_attr<tinyusdz::Visibility>(&local_2e8,attr_03,&local_308,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::__cxx11::string::~string((string *)&local_308);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_309);
  local_3d0 = (tinyusdz *)0x0;
  if (pGStack_18 != (GPrim *)0x0) {
    local_3d0 = (tinyusdz *)&pGStack_18->super_MaterialBinding;
  }
  print_material_binding_abi_cxx11_
            (&local_330,local_3d0,(MaterialBinding *)(ulong)local_1c,(uint32_t)pGStack_18);
  ::std::operator<<(aoStack_198,(string *)&local_330);
  ::std::__cxx11::string::~string((string *)&local_330);
  local_448 = (tinyusdz *)0x0;
  if (pGStack_18 != (GPrim *)0x0) {
    local_448 = (tinyusdz *)&pGStack_18->super_Collection;
  }
  pGVar2 = pGStack_18;
  print_collection_abi_cxx11_
            ((string *)&rel,local_448,(Collection *)(ulong)local_1c,(uint32_t)pGStack_18);
  indent_00 = (uint32_t)pGVar2;
  ::std::operator<<(aoStack_198,(string *)&rel);
  ::std::__cxx11::string::~string((string *)&rel);
  bVar1 = RelationshipProperty::authored(&pGStack_18->proxyPrim);
  if (bVar1) {
    this = RelationshipProperty::relationship(&pGStack_18->proxyPrim);
    local_358 = this;
    local_37c = Relationship::get_listedit_qual(this);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3a0,"proxyPrim",&local_3a1);
    indent_00 = 0;
    anon_unknown_173::print_relationship(&local_378,this,&local_37c,false,&local_3a0,local_1c);
    ::std::operator<<(aoStack_198,(string *)&local_378);
    ::std::__cxx11::string::~string((string *)&local_378);
    ::std::__cxx11::string::~string((string *)&local_3a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  }
  print_xformOps_abi_cxx11_
            (&local_3c8,(tinyusdz *)pGStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)local_1c,
             indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_3c8);
  ::std::__cxx11::string::~string((string *)&local_3c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_gprim_predefined(const T &gprim, const uint32_t indent) {
  std::stringstream ss;

  // properties
  ss << print_typed_attr(gprim.doubleSided, "doubleSided", indent);
  ss << print_typed_token_attr(gprim.orientation, "orientation", indent);
  ss << print_typed_token_attr(gprim.purpose, "purpose", indent);
  ss << print_typed_attr(gprim.extent, "extent", indent);

  ss << print_typed_token_attr(gprim.visibility, "visibility", indent);

  ss << print_material_binding(&gprim, indent);

  ss << print_collection(&gprim, indent);

  if (gprim.proxyPrim.authored()) {
    const Relationship &rel = gprim.proxyPrim.relationship();
    ss << print_relationship(rel, rel.get_listedit_qual(), /* custom */ false,
                             "proxyPrim", indent);
  }

  ss << print_xformOps(gprim.xformOps, indent);

  return ss.str();
}